

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-conv.c
# Opt level: O2

char * filter_escapes(char *str)

{
  char cVar1;
  GString *gstring;
  GString *gstring_00;
  char *pcVar2;
  
  if ((str != (char *)0x0) && (*str != '\0')) {
    gstring = (GString *)g_string_new(0);
    cVar1 = *str;
    do {
      if (cVar1 == '\\') {
        pcVar2 = str + 1;
        cVar1 = str[1];
        if (cVar1 == 'e') {
          cVar1 = '\x1b';
          str = pcVar2;
        }
        else if (cVar1 == 't') {
          cVar1 = '\t';
          str = pcVar2;
        }
        else if (cVar1 == 'r') {
          cVar1 = '\r';
          str = pcVar2;
        }
        else if (cVar1 == 'n') {
          cVar1 = '\n';
          str = pcVar2;
        }
        else {
          cVar1 = '\\';
        }
      }
      g_string_append_c_inline(gstring,cVar1);
      cVar1 = str[1];
      str = str + 1;
    } while (cVar1 != '\0');
    gstring_00 = (GString *)g_string_new("filtered delimiter = ");
    pcVar2 = gstring->str;
    cVar1 = *pcVar2;
    do {
      pcVar2 = pcVar2 + 1;
      if ((byte)(cVar1 + 0x81U) < 0xa1) {
        g_string_append_printf(gstring_00,"\\x%02X",cVar1);
      }
      else {
        g_string_append_c_inline(gstring_00,cVar1);
      }
      cVar1 = *pcVar2;
    } while (cVar1 != '\0');
    g_log("rifiuti2",0x80,"%s",gstring_00->str);
    g_string_free(gstring_00,1);
    pcVar2 = (char *)g_string_free(gstring,0);
    return pcVar2;
  }
  g_return_if_fail_warning("rifiuti2","filter_escapes","(str != NULL) && (*str != \'\\0\')");
  return (char *)0x0;
}

Assistant:

char *
filter_escapes (const char *str)
{
    GString *result, *debug_str;
    char *i = (char *) str;

    g_return_val_if_fail ( (str != NULL) && (*str != '\0'), NULL);

    result = g_string_new (NULL);
    do
    {
        if ( *i != '\\' )
        {
            result = g_string_append_c (result, *i);
            continue;
        }

        switch ( *(++i) )
        {
          case 'r':
            result = g_string_append_c (result, '\r'); break;
          case 'n':
            result = g_string_append_c (result, '\n'); break;
          case 't':
            result = g_string_append_c (result, '\t'); break;
          case 'e':
            result = g_string_append_c (result, '\x1B'); break;
          default:
            result = g_string_append_c (result, '\\'); i--;
        }
    }
    while ( *(++i) );

    debug_str = g_string_new ("filtered delimiter = ");
    i = result->str;
    do
    {
        if ( *i >= 0x20 && *i <= 0x7E )  /* problem during linking with g_ascii_isprint */
            debug_str = g_string_append_c (debug_str, *i);
        else
            g_string_append_printf (debug_str, "\\x%02X", *(unsigned char *) i);
    }
    while ( *(++i) );
    g_debug ("%s", debug_str->str);
    g_string_free (debug_str, TRUE);
    return g_string_free (result, FALSE);
}